

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_wrapper.cpp
# Opt level: O2

void __thiscall pstore::command_line::word_wrapper::next(word_wrapper *this)

{
  string *psVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  string local_40 [32];
  
  psVar1 = this->text_;
  uVar4 = this->start_pos_;
  uVar2 = psVar1->_M_string_length;
  uVar3 = this->max_width_ + uVar4;
  uVar6 = uVar3;
  if (uVar2 < uVar3) {
    uVar6 = uVar2;
  }
  if (uVar3 < uVar2) {
    do {
      uVar3 = uVar6;
      if (uVar3 == 0) break;
      uVar6 = uVar3 - 1;
    } while ((psVar1->_M_dataplus)._M_p[uVar3] != ' ');
    uVar5 = uVar4;
    uVar6 = uVar3;
    if (uVar4 == uVar3) {
      for (; (uVar6 = uVar5, uVar5 < uVar2 && ((psVar1->_M_dataplus)._M_p[uVar5] != ' '));
          uVar5 = uVar5 + 1) {
      }
    }
  }
  if (uVar4 <= uVar6) {
    std::__cxx11::string::substr((ulong)local_40,(ulong)psVar1);
    std::__cxx11::string::operator=((string *)&this->substr_,local_40);
    std::__cxx11::string::~string(local_40);
    uVar4 = uVar2;
    if (uVar2 < uVar6) {
      uVar4 = uVar6;
    }
    for (; (uVar3 = uVar4, uVar6 < uVar2 &&
           (uVar3 = uVar6, (this->text_->_M_dataplus)._M_p[uVar6] == ' ')); uVar6 = uVar6 + 1) {
    }
    this->start_pos_ = uVar3;
    return;
  }
  assert_failed("end_pos >= start_pos_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/word_wrapper.cpp"
                ,0x53);
}

Assistant:

void word_wrapper::next () {
                auto const length = text_.length ();
                std::size_t end_pos = std::min (start_pos_ + max_width_, length);
                if (end_pos < length) {
                    while (end_pos > 0 && text_[end_pos] != ' ') {
                        --end_pos;
                    }
                    if (end_pos == start_pos_) {
                        // We got back to the start without finding a separator! We can't allow the
                        // next() operation to produce nothing (unless start_pos_ is at the end
                        // already). Try searching forward. This line will be too long, but that's
                        // better than looping forever.
                        while (end_pos < length && text_[end_pos] != ' ') {
                            ++end_pos;
                        }
                    }
                }

                PSTORE_ASSERT (end_pos >= start_pos_);
                substr_ = text_.substr (start_pos_, end_pos - start_pos_);

                while (end_pos < length && text_[end_pos] == ' ') {
                    ++end_pos;
                }
                start_pos_ = end_pos;
            }